

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinFoodWeb_kry.c
# Opt level: O2

int func(N_Vector cc,N_Vector fval,void *user_data)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long local_80;
  long local_78;
  
  dVar2 = *(double *)((long)user_data + 0x438);
  dVar3 = *(double *)((long)user_data + 0x440);
  lVar16 = 0;
  for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
    lVar1 = lVar16 + 0x180;
    local_80 = lVar16 + -0x180;
    if (lVar11 == 0) {
      local_80 = lVar1;
    }
    local_78 = lVar16 + -0x180;
    if (lVar11 != 7) {
      local_78 = lVar1;
    }
    for (lVar15 = 0; lVar15 != 8; lVar15 = lVar15 + 1) {
      lVar5 = *(long *)((long)cc->content + 0x10);
      lVar10 = lVar15 * 6 + lVar11 * 0x30;
      lVar6 = *(long *)(**(long **)((long)user_data + 0x410) + 0x10);
      lVar7 = *(long *)((long)fval->content + 0x10);
      WebRate((double)lVar15 * dVar2,(double)lVar11 * dVar3,(realtype *)(lVar10 * 8 + lVar5),
              (realtype *)(lVar6 + lVar10 * 8),user_data);
      lVar10 = lVar16 + 0x30;
      lVar13 = lVar16 + -0x30;
      if (lVar15 == 0) {
        lVar13 = lVar10;
      }
      lVar8 = *(long *)((long)user_data + 0x418);
      lVar12 = lVar16 + -0x30;
      if (lVar15 != 7) {
        lVar12 = lVar10;
      }
      lVar9 = *(long *)((long)user_data + 0x420);
      for (lVar14 = 0; lVar14 != 0x30; lVar14 = lVar14 + 8) {
        dVar4 = *(double *)(lVar16 + lVar5 + lVar14);
        *(double *)(lVar7 + lVar16 + lVar14) =
             ((*(double *)(local_78 + lVar5 + lVar14) - dVar4) -
             (dVar4 - *(double *)(local_80 + lVar5 + lVar14))) * *(double *)(lVar9 + lVar14) +
             ((*(double *)(lVar12 + lVar5 + lVar14) - dVar4) -
             (dVar4 - *(double *)(lVar13 + lVar5 + lVar14))) * *(double *)(lVar8 + lVar14) +
             *(double *)(lVar6 + lVar16 + lVar14);
      }
      local_80 = local_80 + 0x30;
      local_78 = local_78 + 0x30;
      lVar16 = lVar10;
    }
    lVar16 = lVar1;
  }
  return 0;
}

Assistant:

static int func(N_Vector cc, N_Vector fval, void *user_data)
{
  realtype xx, yy, delx, dely, *cxy, *rxy, *fxy, dcyli, dcyui, dcxli, dcxri;
  sunindextype jx, jy, is, idyu, idyl, idxr, idxl;
  UserData data;
  
  data = (UserData)user_data;
  delx = data->dx;
  dely = data->dy;
  
  /* Loop over all mesh points, evaluating rate array at each point*/
  for (jy = 0; jy < MY; jy++) {
    
    yy = dely*jy;

    /* Set lower/upper index shifts, special at boundaries. */
    idyl = (jy != 0   ) ? NSMX : -NSMX;
    idyu = (jy != MY-1) ? NSMX : -NSMX;
    
    for (jx = 0; jx < MX; jx++) {

      xx = delx*jx;

      /* Set left/right index shifts, special at boundaries. */
      idxl = (jx !=  0  ) ?  NUM_SPECIES : -NUM_SPECIES;
      idxr = (jx != MX-1) ?  NUM_SPECIES : -NUM_SPECIES;

      cxy = IJ_Vptr(cc,jx,jy);
      rxy = IJ_Vptr(data->rates,jx,jy);
      fxy = IJ_Vptr(fval,jx,jy);

      /* Get species interaction rate array at (xx,yy) */
      WebRate(xx, yy, cxy, rxy, user_data);
      
      for(is = 0; is < NUM_SPECIES; is++) {
        
        /* Differencing in x direction */
        dcyli = *(cxy+is) - *(cxy - idyl + is) ;
        dcyui = *(cxy + idyu + is) - *(cxy+is);
        
        /* Differencing in y direction */
        dcxli = *(cxy+is) - *(cxy - idxl + is);
        dcxri = *(cxy + idxr +is) - *(cxy+is);
        
        /* Compute the total rate value at (xx,yy) */
        fxy[is] = (coy)[is] * (dcyui - dcyli) +
          (cox)[is] * (dcxri - dcxli) + rxy[is];
        
      } /* end of is loop */
      
    } /* end of jx loop */
    
  } /* end of jy loop */

  return(0);
}